

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O0

bool __thiscall CUIRect::Inside(CUIRect *this,float x,float y)

{
  bool local_11;
  float y_local;
  float x_local;
  CUIRect *this_local;
  
  local_11 = false;
  if (((this->x <= x) && (local_11 = false, x < this->x + this->w)) &&
     (local_11 = false, this->y <= y)) {
    local_11 = y < this->y + this->h;
  }
  return local_11;
}

Assistant:

bool CUIRect::Inside(float x, float y) const
{
	return x >= this->x
		&& x < this->x + this->w
		&& y >= this->y
		&& y < this->y + this->h;
}